

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_loop.c
# Opt level: O3

TValue * cploop_opt(lua_State *L,lua_CFunction dummy,void *ud)

{
  uint32_t *puVar1;
  byte *pbVar2;
  byte bVar3;
  byte bVar4;
  char cVar5;
  ushort uVar6;
  ushort uVar7;
  SnapEntry SVar8;
  jit_State *J;
  SnapEntry *pSVar9;
  SnapEntry *pSVar10;
  bool bVar11;
  uint32_t uVar12;
  TRef TVar13;
  undefined2 *puVar14;
  SnapShot *pSVar15;
  SnapEntry *pSVar16;
  ulong uVar17;
  ushort uVar18;
  ushort uVar19;
  uint uVar20;
  SnapShot *pSVar21;
  SnapEntry *pSVar22;
  IRIns *pIVar23;
  byte bVar24;
  uint uVar25;
  ulong uVar26;
  ulong uVar27;
  bool bVar28;
  ushort uVar29;
  IRRef1 IVar30;
  uint uVar31;
  uint uVar32;
  ulong uVar33;
  IRRef ref;
  uint uVar34;
  uint uVar35;
  ulong uVar36;
  uint uVar37;
  SnapShot *pSVar38;
  SnapShot *pSVar39;
  undefined4 uVar40;
  IRRef1 phi [64];
  uint local_fc;
  IRRef1 local_b8 [68];
  
  J = *ud;
  uVar20 = (J->cur).nins;
  *(uint *)((long)ud + 0x10) = uVar20 - 0x8000;
  puVar14 = (undefined2 *)lj_mem_realloc(J->L,(void *)0x0,0,(ulong)(uVar20 - 0x8000) * 2);
  *(undefined2 **)((long)ud + 8) = puVar14;
  *puVar14 = 0x8000;
  (J->fold).ins.field_0.ot = 0x1180;
  (J->fold).ins.field_1.op12 = 0;
  lj_ir_emit(J);
  uVar6 = (J->cur).nsnap;
  uVar31 = (uint)uVar6 * 2 - 2;
  if (J->sizesnap < uVar31) {
    lj_snap_grow_buf_(J,uVar31);
  }
  pSVar38 = (J->cur).snap;
  uVar31 = uVar6 - 1;
  uVar32 = (uint)pSVar38[uVar31].nent * (uVar6 - 2) + (J->cur).nsnapmap * 2;
  if (J->sizesnapmap < uVar32) {
    lj_snap_grow_map_(J,uVar32);
    pSVar38 = (J->cur).snap;
  }
  uVar32 = pSVar38[uVar31].mapofs;
  pSVar9 = (J->cur).snapmap;
  bVar24 = pSVar38[uVar31].nent;
  pSVar9[(ulong)uVar32 + (ulong)bVar24] = 0xff000000;
  local_fc = 0;
  if (0x8001 < uVar20) {
    puVar1 = &(J->cur).nsnapmap;
    local_fc = 0;
    uVar27 = 0x8001;
    pSVar38 = pSVar38 + 1;
    do {
      pSVar39 = pSVar38;
      if (pSVar38->ref <= uVar27) {
        pSVar39 = pSVar38 + 1;
        uVar31 = pSVar38->mapofs;
        uVar19 = (J->cur).nsnap;
        pSVar21 = (SnapShot *)((long)&((J->cur).snap)->mapofs + (ulong)((uint)uVar19 * 0xc));
        pSVar15 = pSVar39;
        if (pSVar39 == pSVar21) {
          pSVar15 = (SnapShot *)puVar1;
        }
        uVar25 = pSVar15->mapofs;
        bVar3 = pSVar38->nent;
        bVar4 = pSVar38->nslots;
        if ((char)(J->guardemit).irt < '\0') {
          uVar12 = (J->cur).nsnapmap;
          (J->cur).nsnap = uVar19 + 1;
        }
        else {
          uVar12 = pSVar21[-1].mapofs;
          pSVar21 = pSVar21 + -1;
        }
        pSVar10 = (J->cur).snapmap;
        uVar26 = 0;
        (J->guardemit).irt = '\0';
        pSVar21->mapofs = uVar12;
        pSVar21->ref = (IRRef1)(J->cur).nins;
        pSVar21->mcofs = 0;
        pSVar21->nslots = bVar4;
        pSVar21->topslot = pSVar38->topslot;
        pSVar21->count = '\0';
        uVar36 = 0;
        if (bVar3 != 0) {
          uVar36 = 0;
          uVar26 = 0;
          uVar33 = 0;
          do {
            uVar35 = pSVar10[uVar31 + uVar33];
            uVar34 = pSVar9[uVar32 + uVar26] >> 0x18;
            uVar37 = uVar35 >> 0x18;
            if (uVar34 < uVar37) {
              pSVar10[uVar12 + uVar36] = pSVar9[uVar32 + uVar26];
              uVar34 = (int)uVar26 + 1;
            }
            else {
              if (0x7fff < (uVar35 & 0xffff)) {
                uVar35 = (uint)(ushort)puVar14[(ulong)(uVar35 & 0xffff) - 0x8000] |
                         uVar35 & 0xfffb0000;
              }
              uVar34 = (int)uVar26 + (uint)(uVar34 == uVar37);
              pSVar10[uVar12 + uVar36] = uVar35;
              uVar33 = (ulong)((int)uVar33 + 1);
            }
            uVar26 = (ulong)uVar34;
            uVar36 = (ulong)((int)uVar36 + 1);
          } while ((uint)uVar33 < (uint)bVar3);
        }
        uVar34 = (uint)uVar36;
        uVar35 = (uint)uVar26;
        SVar8 = pSVar9[uVar32 + uVar26];
        while (SVar8 >> 0x18 < (uint)bVar4) {
          uVar35 = uVar35 + 1;
          uVar34 = (int)uVar36 + 1;
          pSVar10[uVar12 + uVar36] = SVar8;
          uVar36 = (ulong)uVar34;
          SVar8 = pSVar9[(ulong)uVar32 + (ulong)uVar35];
        }
        pSVar21->nent = (uint8_t)uVar34;
        pSVar16 = pSVar10 + (ulong)uVar12 + (ulong)uVar34;
        for (pSVar22 = pSVar10 + (ulong)uVar31 + (ulong)(uint)bVar3; pSVar22 < pSVar10 + uVar25;
            pSVar22 = pSVar22 + 1) {
          *pSVar16 = *pSVar22;
          pSVar16 = pSVar16 + 1;
        }
        *puVar1 = (uint32_t)((ulong)((long)pSVar16 - (long)pSVar10) >> 2);
      }
      pIVar23 = (J->cur).ir;
      uVar19 = pIVar23[uVar27].field_0.op1;
      uVar18 = uVar19;
      if ((short)uVar19 < 0) {
        uVar18 = puVar14[(ulong)uVar19 - 0x8000];
      }
      uVar7 = *(ushort *)((long)pIVar23 + uVar27 * 8 + 2);
      uVar29 = uVar7;
      if ((short)uVar7 < 0) {
        uVar29 = puVar14[(ulong)uVar7 - 0x8000];
      }
      if ((((lj_ir_mode[*(byte *)((long)pIVar23 + uVar27 * 8 + 5)] & 0x60) == 0) &&
          (uVar18 == uVar19)) && (uVar29 == uVar7)) {
        puVar14[uVar27 - 0x8000] = (short)uVar27;
      }
      else {
        bVar3 = *(byte *)((long)pIVar23 + uVar27 * 8 + 4);
        (J->fold).ins.field_0.ot = *(ushort *)((long)pIVar23 + uVar27 * 8 + 4) & 0xffbf;
        (J->fold).ins.field_0.op1 = uVar18;
        (J->fold).ins.field_0.op2 = uVar29;
        TVar13 = lj_opt_fold(J);
        uVar31 = TVar13 & 0xffff;
        uVar36 = (ulong)uVar31;
        IVar30 = (IRRef1)TVar13;
        puVar14[uVar27 - 0x8000] = IVar30;
        if (uVar27 != uVar36) {
          pIVar23 = (J->cur).ir;
          if (uVar31 < uVar20) {
            bVar4 = *(byte *)((long)pIVar23 + uVar36 * 8 + 4);
            uVar25 = (uint)bVar4;
            if ((0x7fff < uVar31) && (2 < (bVar4 & 0x1f) && (char)((bVar4 & 0x40) >> 6) == '\0')) {
              uVar25 = bVar4 | 0x40;
              *(char *)((long)pIVar23 + uVar36 * 8 + 4) = (char)uVar25;
              if (0x3f < local_fc) {
LAB_0014cf67:
                lj_trace_err(J,LJ_TRERR_PHIOV);
              }
              uVar36 = (ulong)local_fc;
              local_fc = local_fc + 1;
              local_b8[uVar36] = IVar30;
            }
            uVar31 = (uint)bVar3;
            if (((uVar25 ^ uVar31) & 0x1f) != 0) {
              uVar31 = uVar31 & 0x1f;
              if (uVar31 - 0x14 < 0xfffffffb) {
                if ((uVar31 != 0xe) || (uVar40 = 0x5b0e01d3, 4 < (uVar25 & 0x1f) - 0xf)) {
LAB_0014cf74:
                  lj_trace_err(J,LJ_TRERR_TYPEINS);
                }
              }
              else {
                if ((uVar25 & 0x1f) - 0xf < 5) goto LAB_0014ca73;
                uVar40 = 0x5b93326e;
                if (((byte)uVar25 & 0x1f) != 0xe) goto LAB_0014cf74;
              }
              (J->fold).ins.field_0.op1 = IVar30;
              *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = uVar40;
              TVar13 = lj_opt_fold(J);
              uVar31 = TVar13 & 0xffff;
              puVar14[uVar27 - 0x8000] = (short)TVar13;
              pIVar23 = (IRIns *)((ulong)(uVar31 * 8) + (long)(J->cur).ir);
LAB_0014cbd0:
              if ((0x7fff < uVar31 && uVar31 < uVar20) &&
                 (bVar3 = (byte)(pIVar23->field_0).ot, (bVar3 & 0x40) == 0)) {
                (pIVar23->field_1).t.irt = bVar3 | 0x40;
                if (0x3f < local_fc) goto LAB_0014cf67;
                uVar36 = (ulong)local_fc;
                local_fc = local_fc + 1;
                local_b8[uVar36] = (IRRef1)uVar31;
              }
            }
          }
          else if (uVar20 < uVar31 && uVar36 != 0xffff) {
            cVar5 = *(char *)((long)pIVar23 + uVar36 * 8 + 5);
            if (cVar5 == 'I') {
              uVar19 = *(ushort *)((long)pIVar23 + uVar36 * 8 + 2);
              if (uVar19 != 0x7fff) {
                uVar36 = (ulong)(uint)uVar19;
                goto LAB_0014cbc0;
              }
            }
            else if (cVar5 == '[') {
              uVar19 = pIVar23[uVar36].field_0.op1;
              uVar36 = (ulong)uVar19;
LAB_0014cbc0:
              uVar31 = (uint)uVar19;
              if (uVar31 < uVar20) {
                pIVar23 = pIVar23 + uVar36;
                goto LAB_0014cbd0;
              }
            }
          }
        }
      }
LAB_0014ca73:
      uVar27 = uVar27 + 1;
      pSVar38 = pSVar39;
    } while (uVar27 != uVar20);
  }
  pSVar38 = (J->cur).snap;
  if (-1 < (char)(J->guardemit).irt) {
    uVar19 = (J->cur).nsnap - 1;
    (J->cur).nsnap = uVar19;
    (J->cur).nsnapmap = pSVar38[uVar19].mapofs;
  }
  pSVar9[(ulong)uVar32 + (ulong)bVar24] = (J->cur).snapmap[pSVar38->nent];
  uVar19 = J->chain[0x11];
  if (local_fc == 0) {
    uVar27 = 0;
    bVar11 = true;
  }
  else {
    bVar28 = true;
    uVar27 = 0;
    uVar36 = 0;
    do {
      while( true ) {
        uVar26 = uVar36 + 1;
        uVar18 = local_b8[uVar36];
        uVar33 = (ulong)uVar18;
        uVar7 = puVar14[uVar33 - 0x8000];
        uVar36 = uVar26;
        if ((uVar18 != uVar7) && (uVar7 != 0xffff)) break;
        pbVar2 = (byte *)((long)(J->cur).ir + uVar33 * 8 + 4);
        *pbVar2 = *pbVar2 & 0xbf;
LAB_0014ccc7:
        if (uVar26 == local_fc) {
          bVar11 = true;
          uVar17 = uVar27;
          if (bVar28) goto LAB_0014cdd9;
          goto LAB_0014ccf7;
        }
      }
      uVar17 = (ulong)((int)uVar27 + 1);
      local_b8[uVar27] = uVar18;
      pIVar23 = (J->cur).ir;
      uVar27 = uVar17;
      if ((pIVar23[uVar7].field_0.op1 == uVar18) ||
         (*(ushort *)((long)pIVar23 + (ulong)uVar7 * 8 + 2) == uVar18)) goto LAB_0014ccc7;
      pbVar2 = (byte *)((long)pIVar23 + uVar33 * 8 + 4);
      *pbVar2 = *pbVar2 | 0x20;
      bVar28 = false;
    } while (uVar26 != local_fc);
LAB_0014ccf7:
    uVar20 = (J->cur).nins - 1;
    if (uVar19 < uVar20) {
      uVar27 = (ulong)uVar20;
      do {
        pIVar23 = (J->cur).ir;
        uVar18 = *(ushort *)((long)pIVar23 + uVar27 * 8 + 2);
        if ((short)uVar18 < 0) {
          pbVar2 = (byte *)((long)pIVar23 + (ulong)uVar18 * 8 + 4);
          *pbVar2 = *pbVar2 & 0xdf;
        }
        if ((short)pIVar23[uVar27].field_0.op1 < 0) {
          pbVar2 = (byte *)((long)(J->cur).ir + (ulong)pIVar23[uVar27].field_0.op1 * 8 + 4);
          *pbVar2 = *pbVar2 & 0xdf;
          uVar18 = pIVar23[uVar27].field_0.op1;
          if (((uVar18 < uVar19) && ((byte)(*(char *)((long)pIVar23 + uVar27 * 8 + 5) + 0xa1U) < 6))
             && (pIVar23 = (J->cur).ir, *(char *)((long)pIVar23 + (ulong)uVar18 * 8 + 5) == 'd')) {
            pIVar23 = pIVar23 + uVar18;
            do {
              if ((short)(pIVar23->field_0).op2 < 0) {
                pbVar2 = (byte *)((long)(J->cur).ir + (ulong)(pIVar23->field_0).op2 * 8 + 4);
                *pbVar2 = *pbVar2 & 0xdf;
              }
              if (-1 < (short)(pIVar23->field_0).op1) break;
              pIVar23 = (J->cur).ir + (pIVar23->field_0).op1;
              (pIVar23->field_1).t.irt = (pIVar23->field_1).t.irt & 0xdf;
            } while ((pIVar23->field_1).o == 'd');
          }
        }
        uVar27 = uVar27 - 1;
      } while ((uint)uVar19 < (uint)uVar27);
    }
    uVar20 = (uint)(J->cur).nsnap;
    while (uVar20 = uVar20 - 1, uVar6 <= uVar20) {
      pSVar38 = (J->cur).snap;
      uVar27 = (ulong)pSVar38[uVar20].nent;
      if (uVar27 != 0) {
        uVar31 = pSVar38[uVar20].mapofs;
        pSVar9 = (J->cur).snapmap;
        uVar36 = 0;
        do {
          uVar18 = (ushort)pSVar9[uVar31 + uVar36];
          if (0x7fff < uVar18) {
            pbVar2 = (byte *)((long)(J->cur).ir + (ulong)uVar18 * 8 + 4);
            *pbVar2 = *pbVar2 & 0xdf;
          }
          uVar36 = uVar36 + 1;
        } while (uVar27 != uVar36);
      }
    }
    bVar11 = false;
    uVar27 = uVar17;
  }
LAB_0014cdd9:
  uVar20 = J->maxslot + J->baseslot;
  if (1 < uVar20) {
    uVar36 = 1;
    do {
      uVar6 = (ushort)J->slot[uVar36];
      uVar27 = uVar27 & 0xffffffff;
      while ((uVar31 = (uint)uVar6, 0x7fff < uVar31 &&
             (uVar26 = (ulong)uVar31, uVar31 != (ushort)puVar14[uVar26 - 0x8000]))) {
        pIVar23 = (J->cur).ir;
        bVar24 = *(byte *)((long)pIVar23 + uVar26 * 8 + 4);
        *(byte *)((long)pIVar23 + uVar26 * 8 + 4) = bVar24 & 0xdf;
        if (((bVar24 & 0x40) != 0) || ((bVar24 & 0x1f) < 3)) break;
        *(byte *)((long)pIVar23 + uVar26 * 8 + 4) = bVar24 & 0xdf | 0x40;
        if (0x3f < uVar27) goto LAB_0014cf67;
        local_b8[uVar27] = uVar6;
        uVar27 = uVar27 + 1;
        uVar6 = puVar14[uVar26 - 0x8000];
        if (uVar19 < uVar6) break;
      }
      uVar36 = uVar36 + 1;
    } while (uVar36 != uVar20);
  }
  if (!bVar11) {
    if ((int)uVar27 == 0) {
      return (TValue *)0x0;
    }
    uVar36 = 0;
    bVar28 = false;
    do {
      do {
        bVar11 = bVar28;
        pIVar23 = (J->cur).ir;
        if ((*(byte *)((long)pIVar23 + (ulong)local_b8[uVar36] * 8 + 4) & 0x20) == 0) {
          bVar24 = *(byte *)((long)pIVar23 +
                            (ulong)(ushort)puVar14[(ulong)local_b8[uVar36] - 0x8000] * 8 + 4);
          if ((bVar24 & 0x20) != 0) {
            *(byte *)((long)pIVar23 +
                     (ulong)(ushort)puVar14[(ulong)local_b8[uVar36] - 0x8000] * 8 + 4) =
                 bVar24 & 0xdf;
            bVar11 = true;
          }
        }
        uVar36 = uVar36 + 1;
        bVar28 = bVar11;
      } while (uVar36 != (uVar27 & 0xffffffff));
      uVar36 = 0;
      bVar28 = false;
    } while (bVar11);
  }
  if ((int)uVar27 != 0) {
    uVar36 = 0;
    do {
      uVar6 = local_b8[uVar36];
      uVar26 = (ulong)uVar6;
      pIVar23 = (J->cur).ir;
      bVar24 = *(byte *)((long)pIVar23 + uVar26 * 8 + 4);
      if ((bVar24 & 0x20) == 0) {
        uVar18 = puVar14[uVar26 - 0x8000];
        if (uVar19 < uVar18) {
          pbVar2 = (byte *)((long)pIVar23 + (ulong)uVar18 * 8 + 4);
          *pbVar2 = *pbVar2 | 0x40;
          bVar24 = *(byte *)((long)pIVar23 + uVar26 * 8 + 4);
        }
        (J->fold).ins.field_0.ot = bVar24 & 0x1f | 0x1300;
        (J->fold).ins.field_0.op1 = uVar6;
        (J->fold).ins.field_0.op2 = uVar18;
        lj_ir_emit(J);
      }
      else {
        *(byte *)((long)pIVar23 + uVar26 * 8 + 4) = bVar24 & 0x9f;
      }
      uVar36 = uVar36 + 1;
    } while ((uVar27 & 0xffffffff) != uVar36);
  }
  return (TValue *)0x0;
}

Assistant:

static TValue *cploop_opt(lua_State *L, lua_CFunction dummy, void *ud)
{
  UNUSED(L); UNUSED(dummy);
  loop_unroll((LoopState *)ud);
  return NULL;
}